

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O3

int uv__fs_mkstemp(uv_fs_t *req)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  int *piVar3;
  size_t path_length;
  char *path;
  int r;
  uv_fs_t *req_local;
  
  __s = req->path;
  sVar2 = strlen(__s);
  if ((sVar2 < 6) || (iVar1 = strcmp(__s + (sVar2 - 6),"XXXXXX"), iVar1 != 0)) {
    piVar3 = __errno_location();
    *piVar3 = 0x16;
    path._4_4_ = -1;
  }
  else {
    uv_once(&uv__fs_mkstemp::once,uv__mkostemp_initonce);
    if ((uv__fs_mkstemp::no_cloexec_support == 0) && (uv__mkostemp != (_func_int_char_ptr_int *)0x0)
       ) {
      path._4_4_ = (*uv__mkostemp)(__s,0x80000);
      if (-1 < path._4_4_) {
        return path._4_4_;
      }
      piVar3 = __errno_location();
      if (*piVar3 != 0x16) goto LAB_00117a52;
      uv__fs_mkstemp::no_cloexec_support = 1;
    }
    if (req->cb != (uv_fs_cb)0x0) {
      uv_rwlock_rdlock(&req->loop->cloexec_lock);
    }
    path._4_4_ = mkstemp64(__s);
    if ((-1 < path._4_4_) && (iVar1 = uv__cloexec(path._4_4_,1), iVar1 != 0)) {
      iVar1 = uv__close(path._4_4_);
      if (iVar1 != 0) {
        abort();
      }
      path._4_4_ = -1;
    }
    if (req->cb != (uv_fs_cb)0x0) {
      uv_rwlock_rdunlock(&req->loop->cloexec_lock);
    }
  }
LAB_00117a52:
  if (path._4_4_ < 0) {
    *__s = '\0';
  }
  return path._4_4_;
}

Assistant:

static int uv__fs_mkstemp(uv_fs_t* req) {
  static uv_once_t once = UV_ONCE_INIT;
  int r;
#ifdef O_CLOEXEC
  static _Atomic int no_cloexec_support;
#endif
  static const char pattern[] = "XXXXXX";
  static const size_t pattern_size = sizeof(pattern) - 1;
  char* path;
  size_t path_length;

  path = (char*) req->path;
  path_length = strlen(path);

  /* EINVAL can be returned for 2 reasons:
      1. The template's last 6 characters were not XXXXXX
      2. open() didn't support O_CLOEXEC
     We want to avoid going to the fallback path in case
     of 1, so it's manually checked before. */
  if (path_length < pattern_size ||
      strcmp(path + path_length - pattern_size, pattern)) {
    errno = EINVAL;
    r = -1;
    goto clobber;
  }

  uv_once(&once, uv__mkostemp_initonce);

#ifdef O_CLOEXEC
  if (atomic_load_explicit(&no_cloexec_support, memory_order_relaxed) == 0 &&
      uv__mkostemp != NULL) {
    r = uv__mkostemp(path, O_CLOEXEC);

    if (r >= 0)
      return r;

    /* If mkostemp() returns EINVAL, it means the kernel doesn't
       support O_CLOEXEC, so we just fallback to mkstemp() below. */
    if (errno != EINVAL)
      goto clobber;

    /* We set the static variable so that next calls don't even
       try to use mkostemp. */
    atomic_store_explicit(&no_cloexec_support, 1, memory_order_relaxed);
  }
#endif  /* O_CLOEXEC */

  if (req->cb != NULL)
    uv_rwlock_rdlock(&req->loop->cloexec_lock);

  r = mkstemp(path);

  /* In case of failure `uv__cloexec` will leave error in `errno`,
   * so it is enough to just set `r` to `-1`.
   */
  if (r >= 0 && uv__cloexec(r, 1) != 0) {
    r = uv__close(r);
    if (r != 0)
      abort();
    r = -1;
  }

  if (req->cb != NULL)
    uv_rwlock_rdunlock(&req->loop->cloexec_lock);

clobber:
  if (r < 0)
    path[0] = '\0';
  return r;
}